

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
JsUtil::
List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::EnsureArray(List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *this,int32 requiredCapacity)

{
  int left;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  RangeCharacterPair *src;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RangeCharacterPair *dst;
  Type pRVar8;
  size_t sVar9;
  int32 local_3c;
  int32 local_38;
  int32 newBufferSize;
  int32 oldBufferSize;
  int32 newLength;
  
  if ((this->
      super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
      ).buffer == (Type)0x0) {
    if (requiredCapacity < this->increment) {
      requiredCapacity = this->increment;
    }
    if (requiredCapacity == 0) {
      pRVar8 = (Type)&DAT_00000008;
    }
    else {
      pAVar1 = &((this->
                 super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                 ).alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)requiredCapacity;
      sVar9 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0xc),8) == 0) {
        sVar9 = SUB168(auVar3 * ZEXT816(0xc),0);
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00b731bf;
        *puVar7 = 0;
      }
      if (sVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                           "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar5) goto LAB_00b731bf;
        *puVar7 = 0;
      }
      pRVar8 = (Type)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(pAVar1,sVar9);
      if (pRVar8 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_00b731bf;
        *puVar7 = 0;
      }
    }
    (this->
    super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
    ).buffer = pRVar8;
    (this->
    super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
    ).count = 0;
    this->length = requiredCapacity;
    return;
  }
  left = this->length;
  if ((this->
      super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
      ).count != left && requiredCapacity <= left) {
    return;
  }
  newBufferSize = 0;
  local_3c = 0;
  local_38 = 0;
  bVar5 = Int32Math::Add(left,1,&newBufferSize);
  if ((bVar5) || (bVar5 = Int32Math::Shl(newBufferSize,1,&newBufferSize), bVar5)) {
    ExternalApi::RaiseOnIntOverflow();
  }
  if (requiredCapacity < newBufferSize) {
    requiredCapacity = newBufferSize;
  }
  newBufferSize = requiredCapacity;
  bVar5 = Int32Math::Mul(0xc,requiredCapacity,&local_3c);
  if ((bVar5) || (bVar5 = Int32Math::Mul(0xc,this->length,&local_38), bVar5)) {
    ExternalApi::RaiseOnIntOverflow();
  }
  if ((long)newBufferSize == 0) {
    dst = (RangeCharacterPair *)&DAT_00000008;
  }
  else {
    pAVar1 = &((this->
               super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
               ).alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)newBufferSize;
    sVar9 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
      sVar9 = SUB168(auVar2 * ZEXT816(0xc),0);
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00b731bf;
      *puVar7 = 0;
    }
    if (sVar9 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar5) goto LAB_00b731bf;
      *puVar7 = 0;
    }
    dst = (RangeCharacterPair *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (pAVar1,sVar9);
    if (dst == (RangeCharacterPair *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) {
LAB_00b731bf:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
  }
  src = (this->
        super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer;
  Memory::
  CopyArray<JSON::JSONScanner::RangeCharacterPair,JSON::JSONScanner::RangeCharacterPair,Memory::ArenaAllocator>
            (dst,(long)newBufferSize,src,(long)this->length);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&((this->
               super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
               ).alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             src,(long)local_38);
  this->length = newBufferSize;
  (this->
  super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
  ).buffer = dst;
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }